

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.hpp
# Opt level: O2

string * __thiscall
CLI::Timer::make_time_str_abi_cxx11_(string *__return_storage_ptr__,Timer *this,double time)

{
  string *this_00;
  anon_class_1_0_00000001 print_it;
  allocator local_92;
  anon_class_1_0_00000001 local_91;
  double local_90;
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  local_90 = time;
  if (1e-06 <= time) {
    if (0.001 <= time) {
      if (1.0 <= time) {
        ::std::__cxx11::string::string((string *)&local_88,"s",&local_92);
        make_time_str::anon_class_1_0_00000001::operator()
                  (__return_storage_ptr__,&local_91,local_90,&local_88);
        this_00 = &local_88;
      }
      else {
        ::std::__cxx11::string::string((string *)&local_68,"ms",&local_92);
        make_time_str::anon_class_1_0_00000001::operator()
                  (__return_storage_ptr__,&local_91,local_90 * 1000.0,&local_68);
        this_00 = &local_68;
      }
    }
    else {
      ::std::__cxx11::string::string((string *)&local_48,"us",&local_92);
      make_time_str::anon_class_1_0_00000001::operator()
                (__return_storage_ptr__,&local_91,local_90 * 1000000.0,&local_48);
      this_00 = &local_48;
    }
  }
  else {
    ::std::__cxx11::string::string((string *)&local_28,"ns",&local_92);
    make_time_str::anon_class_1_0_00000001::operator()
              (__return_storage_ptr__,&local_91,local_90 * 1000000000.0,&local_28);
    this_00 = &local_28;
  }
  ::std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

std::string make_time_str(double time) const {
        auto print_it = [](double x, std::string unit) {
            char buffer[50];
            std::snprintf(buffer, 50, "%.5g", x);
            return buffer + std::string(" ") + unit;
        };

        if(time < .000001)
            return print_it(time * 1000000000, "ns");
        else if(time < .001)
            return print_it(time * 1000000, "us");
        else if(time < 1)
            return print_it(time * 1000, "ms");
        else
            return print_it(time, "s");
    }